

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

Iterator __thiscall Map<int,_int>::find(Map<int,_int> *this,int *key)

{
  Item *local_28;
  Item *item;
  int *key_local;
  Map<int,_int> *this_local;
  
  local_28 = this->root;
  while( true ) {
    while( true ) {
      if (local_28 == (Item *)0x0) {
        return (Iterator)(this->_end).item;
      }
      if (*key <= local_28->key) break;
      local_28 = local_28->right;
    }
    if (local_28->key <= *key) break;
    local_28 = local_28->left;
  }
  Iterator::Iterator((Iterator *)&this_local,local_28);
  return (Iterator)(Item *)this_local;
}

Assistant:

Iterator find(const T& key) const
  {
    for(Item* item = root; item; )
    {
      if(key > item->key)
      {
        item = item->right;
        continue;
      }
      else if(key < item->key)
      {
        item = item->left;
        continue;
      }
      else
        return item;
    }
    return _end;
  }